

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O1

MPP_RET vdpp2_deinit(VdppCtx ictx)

{
  MPP_RET MVar1;
  
  if (ictx == (VdppCtx)0x0) {
    _mpp_log_l(2,"vdpp2","found NULL input vdpp ctx %p\n","vdpp2_deinit",0);
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    MVar1 = MPP_OK;
    if (-1 < *ictx) {
      close(*ictx);
      *(undefined4 *)ictx = 0xffffffff;
      MVar1 = MPP_OK;
    }
  }
  return MVar1;
}

Assistant:

MPP_RET vdpp2_deinit(VdppCtx ictx)
{
    struct vdpp2_api_ctx *ctx = NULL;

    if (NULL == ictx) {
        mpp_err_f("found NULL input vdpp ctx %p\n", ictx);
        return MPP_ERR_NULL_PTR;
    }

    ctx = ictx;

    if (ctx->fd >= 0) {
        close(ctx->fd);
        ctx->fd = -1;
    }

    return MPP_OK;
}